

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::rc::TextureCubeArray::TextureCubeArray(TextureCubeArray *this,deUint32 name)

{
  deUint32 name_local;
  TextureCubeArray *this_local;
  
  rc::Texture::Texture(&this->super_Texture,name,TYPE_CUBE_MAP_ARRAY);
  (this->super_Texture).super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__TextureCubeArray_032e8918;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  tcu::TextureCubeArrayView::TextureCubeArrayView(&this->m_view,0,(ConstPixelBufferAccess *)0x0);
  return;
}

Assistant:

TextureCubeArray::TextureCubeArray (deUint32 name)
	: Texture	(name, TYPE_CUBE_MAP_ARRAY)
	, m_view	(0, DE_NULL)
{
}